

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::
OnCallSpec<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
::Matches(OnCallSpec<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>>,std::tuple<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>>
                    ((tuple<testing::Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>_>_>
                      *)(this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>_>_&>
            ::Matches((MatcherBase<const_std::tuple<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>_>_&>
                       *)(this + 0x28),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }